

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_blocks.cpp
# Opt level: O0

int libtorrent::aux::source_rank(peer_source_flags_t source_bitmask)

{
  bool bVar1;
  bitfield_flag local_1a;
  uchar local_19;
  uchar local_18;
  bitfield_flag local_17;
  uchar local_16;
  uchar local_15;
  bitfield_flag local_14;
  uchar local_13;
  uchar local_12;
  bitfield_flag local_11;
  uint local_10;
  bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void> local_9;
  int ret;
  peer_source_flags_t source_bitmask_local;
  
  local_10 = 0;
  local_13 = '\x01';
  local_12 = source_bitmask.m_val;
  local_9.m_val = source_bitmask.m_val;
  local_11 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>)
                        source_bitmask.m_val,
                        (bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>)
                        '\x01');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_11);
  if (bVar1) {
    local_10 = local_10 | 0x20;
  }
  local_15 = local_9.m_val;
  local_16 = '\b';
  local_14 = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_9,(bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>
                                 )'\b');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_14);
  if (bVar1) {
    local_10 = local_10 | 0x10;
  }
  local_18 = local_9.m_val;
  local_19 = '\x02';
  local_17 = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_9,(bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>
                                 )'\x02');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_17);
  if (bVar1) {
    local_10 = local_10 | 8;
  }
  local_1a = (bitfield_flag)
             libtorrent::flags::operator&
                       (local_9,(bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>
                                 )'\x04');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1a);
  if (bVar1) {
    local_10 = local_10 | 4;
  }
  return local_10;
}

Assistant:

int source_rank(peer_source_flags_t const source_bitmask)
	{
		int ret = 0;
		if (source_bitmask & peer_info::tracker) ret |= 1 << 5;
		if (source_bitmask & peer_info::lsd) ret |= 1 << 4;
		if (source_bitmask & peer_info::dht) ret |= 1 << 3;
		if (source_bitmask & peer_info::pex) ret |= 1 << 2;
		return ret;
	}